

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall
duckdb::ART::VerifyLeaf
          (ART *this,Node *leaf,ARTKey *key,optional_ptr<duckdb::ART,_true> delete_art,
          ConflictManager *manager,optional_idx *conflict_idx,idx_t i)

{
  bool bVar1;
  ART *this_00;
  ART *pAVar2;
  unsafe_optional_ptr<const_Node> uVar3;
  InternalException *this_01;
  ulong uVar4;
  allocator local_129;
  ConflictManager *local_128;
  optional_idx *local_120;
  unsafe_vector<row_t> row_ids;
  string local_f8;
  ART *local_d8;
  optional_ptr<duckdb::ART,_true> delete_art_local;
  ARTKey empty_key;
  Iterator it;
  
  uVar4 = (leaf->super_IndexPointer).data;
  delete_art_local.ptr = delete_art.ptr;
  if ((uVar4 & 0x7f00000000000000) == 0x700000000000000) {
    if (delete_art.ptr == (ART *)0x0) {
      bVar1 = ConflictManager::AddHit(manager,i,uVar4 & 0xffffffffffffff);
      if (!bVar1) {
        return;
      }
      optional_idx::optional_idx((optional_idx *)&it,i);
      goto LAB_01a1e247;
    }
LAB_01a1e068:
    local_128 = manager;
    local_120 = conflict_idx;
    local_d8 = this;
    this_00 = optional_ptr<duckdb::ART,_true>::operator->(&delete_art_local);
    pAVar2 = optional_ptr<duckdb::ART,_true>::operator->(&delete_art_local);
    uVar3 = Lookup(this_00,&pAVar2->tree,key,0);
    conflict_idx = local_120;
    uVar4 = (leaf->super_IndexPointer).data;
    this = local_d8;
    manager = local_128;
    if ((uVar4 & 0x7f00000000000000) != 0x700000000000000) goto LAB_01a1e111;
    if (uVar3.ptr == (Node *)0x0) {
LAB_01a1e206:
      uVar4 = uVar4 & 0xffffffffffffff;
      goto LAB_01a1e224;
    }
    uVar4 = uVar4 & 0xffffffffffffff;
    if ((((uVar3.ptr)->super_IndexPointer).data & 0xffffffffffffff) != uVar4) goto LAB_01a1e224;
    bVar1 = ConflictManager::AddMiss(local_128,i);
  }
  else {
    if (delete_art.ptr != (ART *)0x0) goto LAB_01a1e068;
    if ((uVar4 & 0x7f00000000000000) == 0x700000000000000) goto LAB_01a1e206;
    uVar3.ptr = (Node *)0x0;
LAB_01a1e111:
    if ((this->super_BoundIndex).index_constraint_type != FOREIGN) {
      Iterator::Iterator(&it,this);
      Iterator::FindMinimum(&it,leaf);
      ARTKey::ARTKey(&empty_key);
      row_ids.super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      row_ids.super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      row_ids.super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar1 = Iterator::Scan(&it,&empty_key,2,&row_ids,false);
      if ((!bVar1) ||
         ((long)row_ids.super_vector<long,_std::allocator<long>_>.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)row_ids.super_vector<long,_std::allocator<long>_>.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start != 0x10)) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_f8,"VerifyLeaf expects exactly two row IDs to be scanned",
                   &local_129);
        InternalException::InternalException(this_01,&local_f8);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (uVar3.ptr == (Node *)0x0) {
        bVar1 = ConflictManager::AddHit
                          (manager,i,
                           *row_ids.super_vector<long,_std::allocator<long>_>.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
        if ((!bVar1) &&
           (bVar1 = ConflictManager::AddHit
                              (manager,i,
                               row_ids.super_vector<long,_std::allocator<long>_>.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start[1]), !bVar1)) goto LAB_01a1e2c4;
        optional_idx::optional_idx((optional_idx *)&local_f8,i);
      }
      else {
        uVar4 = ((uVar3.ptr)->super_IndexPointer).data & 0xffffffffffffff;
        if ((uVar4 == *row_ids.super_vector<long,_std::allocator<long>_>.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start) ||
           (uVar4 == row_ids.super_vector<long,_std::allocator<long>_>.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1])) {
          bVar1 = ConflictManager::AddMiss(manager,i);
          if (!bVar1) goto LAB_01a1e2c4;
          optional_idx::optional_idx((optional_idx *)&local_f8,i);
        }
        else {
          bVar1 = ConflictManager::AddHit
                            (manager,i,
                             *row_ids.super_vector<long,_std::allocator<long>_>.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
          if ((!bVar1) &&
             (bVar1 = ConflictManager::AddHit
                                (manager,i,
                                 row_ids.super_vector<long,_std::allocator<long>_>.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[1]), !bVar1)) goto LAB_01a1e2c4;
          optional_idx::optional_idx((optional_idx *)&local_f8,i);
        }
      }
      conflict_idx->index = (idx_t)local_f8._M_dataplus._M_p;
LAB_01a1e2c4:
      ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&row_ids);
      Iterator::~Iterator(&it);
      return;
    }
    uVar4 = 0x7ffffffffff080;
LAB_01a1e224:
    bVar1 = ConflictManager::AddHit(manager,i,uVar4);
  }
  if (bVar1 == false) {
    return;
  }
  optional_idx::optional_idx((optional_idx *)&it,i);
LAB_01a1e247:
  conflict_idx->index =
       (idx_t)it.current_key.key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  return;
}

Assistant:

void ART::VerifyLeaf(const Node &leaf, const ARTKey &key, optional_ptr<ART> delete_art, ConflictManager &manager,
                     optional_idx &conflict_idx, idx_t i) {
	// Fast path, the leaf is inlined, and the delete ART does not exist.
	if (leaf.GetType() == NType::LEAF_INLINED && !delete_art) {
		if (manager.AddHit(i, leaf.GetRowId())) {
			conflict_idx = i;
		}
		return;
	}

	// Get the delete_leaf.
	// All leaves in the delete ART are inlined.
	unsafe_optional_ptr<const Node> deleted_leaf;
	if (delete_art) {
		deleted_leaf = delete_art->Lookup(delete_art->tree, key, 0);
	}

	// The leaf is inlined, and there is no deleted leaf with the same key.
	if (leaf.GetType() == NType::LEAF_INLINED && !deleted_leaf) {
		if (manager.AddHit(i, leaf.GetRowId())) {
			conflict_idx = i;
		}
		return;
	}

	// The leaf is inlined, and the same key exists in the delete ART.
	if (leaf.GetType() == NType::LEAF_INLINED && deleted_leaf) {
		D_ASSERT(deleted_leaf->GetType() == NType::LEAF_INLINED);
		auto deleted_row_id = deleted_leaf->GetRowId();
		auto this_row_id = leaf.GetRowId();

		if (deleted_row_id == this_row_id) {
			if (manager.AddMiss(i)) {
				conflict_idx = i;
			}
			return;
		}

		if (manager.AddHit(i, this_row_id)) {
			conflict_idx = i;
		}
		return;
	}

	// Fast path for FOREIGN KEY constraints.
	// Up to here, the above code paths work implicitly for FKs, as the leaf is inlined.
	// FIXME: proper foreign key + delete ART support.
	if (index_constraint_type == IndexConstraintType::FOREIGN) {
		D_ASSERT(!deleted_leaf);
		// We don't handle FK conflicts in UPSERT, so the row ID should not matter.
		if (manager.AddHit(i, MAX_ROW_ID)) {
			conflict_idx = i;
		}
		return;
	}

	// Scan the two row IDs in the leaf.
	Iterator it(*this);
	it.FindMinimum(leaf);
	ARTKey empty_key = ARTKey();
	unsafe_vector<row_t> row_ids;
	auto success = it.Scan(empty_key, 2, row_ids, false);
	if (!success || row_ids.size() != 2) {
		throw InternalException("VerifyLeaf expects exactly two row IDs to be scanned");
	}

	if (!deleted_leaf) {
		if (manager.AddHit(i, row_ids[0]) || manager.AddHit(i, row_ids[1])) {
			conflict_idx = i;
		}
		return;
	}

	auto deleted_row_id = deleted_leaf->GetRowId();
	if (deleted_row_id == row_ids[0] || deleted_row_id == row_ids[1]) {
		if (manager.AddMiss(i)) {
			conflict_idx = i;
		}
		return;
	}

	if (manager.AddHit(i, row_ids[0]) || manager.AddHit(i, row_ids[1])) {
		conflict_idx = i;
	}
}